

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O0

type jsoncons::detail::hex_to_integer<long,char>(char *s,size_t length,long *n)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  long in_RSI;
  char *in_RDI;
  type tVar4;
  long x_1;
  char c_1;
  long x;
  char c;
  char *end;
  string *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  long local_88;
  long local_78;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  undefined3 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffa4;
  char *local_18;
  to_integer_result<long,_char> local_10;
  
  if (in_RSI == 0) {
    uVar5 = CONCAT13(1,in_stack_ffffffffffffffa0);
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,uVar5),in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    assertion_error::assertion_error
              ((assertion_error *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    __cxa_throw(uVar3,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  *in_RDX = 0;
  local_18 = in_RDI;
  if (*in_RDI == '-') {
    for (local_18 = in_RDI + 1; local_18 < in_RDI + in_RSI; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      iVar2 = (int)cVar1;
      if (iVar2 - 0x30U < 10) {
        local_78 = (long)(cVar1 + -0x30);
      }
      else if (iVar2 - 0x41U < 6) {
        local_78 = (long)(cVar1 + -0x37);
      }
      else {
        if (5 < iVar2 - 0x61U) {
          to_integer_result<long,_char>::to_integer_result(&local_10,local_18,invalid_digit);
          uVar3 = extraout_RDX;
          goto LAB_0029d1fa;
        }
        local_78 = (long)(cVar1 + -0x57);
      }
      if (*in_RDX < -0x800000000000000) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar3 = extraout_RDX_00;
        goto LAB_0029d1fa;
      }
      *in_RDX = *in_RDX << 4;
      if (*in_RDX < local_78 + -0x8000000000000000) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar3 = extraout_RDX_01;
        goto LAB_0029d1fa;
      }
      *in_RDX = *in_RDX - local_78;
    }
  }
  else {
    for (; local_18 < in_RDI + in_RSI; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      iVar2 = (int)cVar1;
      if (iVar2 - 0x30U < 10) {
        local_88 = (long)(cVar1 + -0x30);
      }
      else if (iVar2 - 0x41U < 6) {
        local_88 = (long)(cVar1 + -0x37);
      }
      else {
        if (5 < iVar2 - 0x61U) {
          to_integer_result<long,_char>::to_integer_result(&local_10,local_18,invalid_digit);
          uVar3 = extraout_RDX_02;
          goto LAB_0029d1fa;
        }
        local_88 = (long)(cVar1 + -0x57);
      }
      if (0x7ffffffffffffff < *in_RDX) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar3 = extraout_RDX_03;
        goto LAB_0029d1fa;
      }
      *in_RDX = *in_RDX << 4;
      if (0x7fffffffffffffff - local_88 < *in_RDX) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar3 = extraout_RDX_04;
        goto LAB_0029d1fa;
      }
      *in_RDX = local_88 + *in_RDX;
    }
  }
  to_integer_result<long,_char>::to_integer_result(&local_10,local_18,success);
  uVar3 = extraout_RDX_05;
LAB_0029d1fa:
  tVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  tVar4.ec = local_10.ec;
  tVar4.ptr = local_10.ptr;
  return tVar4;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
hex_to_integer(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_16 = min_value / 16;
        ++s;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n < min_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_16 = max_value / 16;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n > max_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}